

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void AssignmentExpression_modeq_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_a0 [8];
  JsValue v0;
  JsValue r4;
  JsValue r3;
  JsValue r2;
  JsValue r1;
  JsAstAssignmentExpressionNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&r3.u + 8));
  (*JsNodeClassEval[*(uint *)&(na[1].location)->filename])
            ((JsAstNode *)na[1].location,context,(JsValue *)((long)&r4.u + 8));
  JsGetValue((JsValue *)((long)&r4.u + 8),(JsValue *)((long)&v0.u + 8));
  MultiplicativeExpression_mod_common
            ((JsValue *)((long)&r3.u + 8),(JsValue *)((long)&v0.u + 8),context,res);
  JsPutValue((JsValue *)((long)&r2.u + 8),res,(JsValue *)local_a0);
  return;
}

Assistant:

static void
AssignmentExpression_modeq_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstAssignmentExpressionNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstAssignmentExpressionNode *n = 
		CAST_NODE(na, JsAstAssignmentExpressionNode);
	struct JsValue r1, r2, r3, r4, v0;

	EVAL(n->lhs, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->expr, context, &r3);
	JsGetValue( &r3, &r4);
	MultiplicativeExpression_mod_common(&r2, &r4, context, res);
	JsPutValue( &r1, res, &v0);
}